

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O0

void __thiscall FunctionCallNode::~FunctionCallNode(FunctionCallNode *this)

{
  FunctionCallNode *in_RDI;
  
  ~FunctionCallNode(in_RDI);
  operator_delete(in_RDI,0x48);
  return;
}

Assistant:

FunctionCallNode(const std::string& name, 
    std::list<std::shared_ptr<ExpressionNode>> arguments):
      name_(name), arguments_(std::move(arguments)) {}